

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[33],char[15],unsigned_int,char[14],char_const*,char[29],char_const*,char[27]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [33],char (*Args_1) [15],
          uint *Args_2,char (*Args_3) [14],char **Args_4,char (*Args_5) [29],char **Args_6,
          char (*Args_7) [27])

{
  stringstream local_1c8 [8];
  stringstream ss;
  char **Args_local_4;
  char (*Args_local_3) [14];
  uint *Args_local_2;
  char (*Args_local_1) [15];
  char (*Args_local) [33];
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  FormatStrSS<std::__cxx11::stringstream,char[33],char[15],unsigned_int,char[14],char_const*,char[29],char_const*,char[27]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (char (*) [33])this,(char (*) [15])Args,(uint *)Args_1,(char (*) [14])Args_2,
             (char **)Args_3,(char (*) [29])Args_4,(char **)Args_5,(char (*) [27])Args_6);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}